

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_5UL> kj::hex(unsigned_short i)

{
  ushort uVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  undefined6 in_register_0000003a;
  bool bVar7;
  CappedArray<char,_5UL> CVar8;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  if ((int)CONCAT62(in_register_0000003a,i) == 0) {
    pbVar4 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    pbVar4 = reverse;
    uVar6 = CONCAT62(in_register_0000003a,i);
    do {
      *pbVar4 = (byte)(uVar6 & 0xffff) & 0xf;
      pbVar4 = pbVar4 + 1;
      uVar1 = (ushort)uVar6;
      uVar6 = (uVar6 & 0xffff) >> 4;
    } while (0xf < uVar1);
    pcVar3 = result.content;
    if (pbVar4 <= reverse) {
      uVar6 = 0;
      goto LAB_0022e95d;
    }
  }
  pbVar5 = pbVar4 + 0xb;
  pcVar2 = result.content;
  do {
    pbVar4 = pbVar4 + -1;
    *pcVar2 = "0123456789abcdef"[*pbVar4];
    pcVar3 = pcVar2 + 1;
    bVar7 = (byte *)pcVar2 != pbVar5;
    pcVar2 = pcVar3;
  } while (bVar7);
  uVar6 = result._8_8_ & 0xffffffffff;
LAB_0022e95d:
  CVar8.currentSize = (long)pcVar3 - (long)result.content;
  CVar8.content[0] = (char)uVar6;
  CVar8.content[1] = (char)(uVar6 >> 8);
  CVar8.content[2] = (char)(uVar6 >> 0x10);
  CVar8.content[3] = (char)(uVar6 >> 0x18);
  CVar8.content[4] = (char)(uVar6 >> 0x20);
  CVar8._13_3_ = (int3)(uVar6 >> 0x28);
  return CVar8;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}